

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

VariableData *
AddFunctionUpvalue(ExpressionContext *ctx,SynBase *source,FunctionData *function,VariableData *data)

{
  int iVar1;
  uint uVar2;
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr prefix;
  InplaceStr prefix_00;
  InplaceStr prefix_01;
  SmallArray<TypeBase_*,_2U> *pSVar3;
  FunctionData *pFVar4;
  SynBase *pSVar5;
  SynBase *ctx_00;
  bool bVar6;
  TypeRef *pTVar7;
  MemberHandle *pMVar8;
  UpvalueData *pUVar9;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe54;
  uint uniqueId;
  ExpressionContext *ctx_01;
  UpvalueData *local_108;
  UpvalueData *upvalue;
  VariableData *local_f0;
  VariableData *local_e8;
  InplaceStr local_e0;
  VariableData *local_d0;
  VariableData *copy;
  VariableData *local_b8;
  VariableData *local_b0;
  InplaceStr local_a8;
  VariableData *local_98;
  VariableData *nextUpvalue;
  VariableData *local_80;
  VariableData *local_78;
  InplaceStr local_70;
  ExpressionContext *local_60;
  VariableData *target;
  Lexeme *pLStack_50;
  uint index;
  ScopeData *currScope;
  TypeClass *classType;
  TypeRef *refType;
  UpvalueData **prev;
  VariableData *data_local;
  FunctionData *function_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  prev = (UpvalueData **)data;
  data_local = (VariableData *)function;
  function_local = (FunctionData *)source;
  source_local = (SynBase *)ctx;
  refType = (TypeRef *)
            SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U>::find
                      (&function->upvalueVariableMap,(VariableData **)&prev);
  if (refType == (TypeRef *)0x0) {
    classType = (TypeClass *)getType<TypeRef>(*(TypeBase **)&data_local->nameHash);
    if (classType == (TypeClass *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0xff7,
                    "VariableData *AddFunctionUpvalue(ExpressionContext &, SynBase *, FunctionData *, VariableData *)"
                   );
    }
    currScope = (ScopeData *)getType<TypeClass>((TypeBase *)(classType->super_TypeStruct).typeScope)
    ;
    if (currScope == (ScopeData *)0x0) {
      __assert_fail("classType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0xffb,
                    "VariableData *AddFunctionUpvalue(ExpressionContext &, SynBase *, FunctionData *, VariableData *)"
                   );
    }
    pLStack_50 = source_local[0x205].end;
    source_local[0x205].end = (Lexeme *)(currScope->types).little[1];
    target._4_4_ = 0;
    bVar6 = SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::contains
                      ((SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *)
                       &data_local[1].offsetUsers.storage[3].value,
                       (InplaceStr *)&prev[5][1].nextUpvalue);
    if (bVar6) {
      target._4_4_ = IntrusiveList<MemberHandle>::size
                               ((IntrusiveList<MemberHandle> *)&(currScope->types).allocator);
    }
    pSVar5 = source_local;
    pFVar4 = function_local;
    pTVar7 = ExpressionContext::GetReferenceType
                       ((ExpressionContext *)source_local,(TypeBase *)prev[4]);
    local_80 = prev[5][1].nextUpvalue;
    local_78 = prev[5][1].copy;
    ctx_01 = (ExpressionContext *)source_local;
    InplaceStr::InplaceStr((InplaceStr *)&nextUpvalue,"target");
    prefix_01.end = (char *)local_78;
    prefix_01.begin = (char *)local_80;
    local_70 = GetFunctionContextMemberName(ctx_01,prefix_01,_nextUpvalue,target._4_4_);
    iVar1 = *(int *)((long)&source_local[0x228].next + 4);
    *(int *)((long)&source_local[0x228].next + 4) = iVar1 + 1;
    name.begin._4_4_ = in_stack_fffffffffffffe4c;
    name.begin._0_4_ = 1;
    name.end._0_4_ = iVar1;
    name.end._4_4_ = in_stack_fffffffffffffe54;
    uniqueId = (uint)ctx_01;
    local_60 = (ExpressionContext *)
               anon_unknown.dwarf_8df1c::AllocateClassMember
                         ((anon_unknown_dwarf_8df1c *)pSVar5,(ExpressionContext *)pFVar4,
                          (SynBase *)0x0,(uint)pTVar7,(TypeBase *)local_70.begin,name,
                          local_70.end._0_1_,uniqueId);
    pSVar3 = &currScope->types;
    pMVar8 = ExpressionContext::get<MemberHandle>((ExpressionContext *)source_local);
    MemberHandle::MemberHandle(pMVar8,(SynBase *)0x0,(VariableData *)local_60,(SynBase *)0x0);
    IntrusiveList<MemberHandle>::push_back((IntrusiveList<MemberHandle> *)&pSVar3->allocator,pMVar8)
    ;
    pSVar5 = source_local;
    pFVar4 = function_local;
    pTVar7 = ExpressionContext::GetReferenceType
                       ((ExpressionContext *)source_local,*(TypeBase **)&source_local[0x226].listed)
    ;
    ctx_00 = source_local;
    local_b8 = prev[5][1].nextUpvalue;
    local_b0 = prev[5][1].copy;
    InplaceStr::InplaceStr((InplaceStr *)&copy,"nextUpvalue");
    prefix_00.end = (char *)local_b0;
    prefix_00.begin = (char *)local_b8;
    local_a8 = GetFunctionContextMemberName
                         ((ExpressionContext *)ctx_00,prefix_00,_copy,target._4_4_);
    iVar1 = *(int *)((long)&source_local[0x228].next + 4);
    *(int *)((long)&source_local[0x228].next + 4) = iVar1 + 1;
    name_00.begin._4_4_ = in_stack_fffffffffffffe4c;
    name_00.begin._0_4_ = 1;
    name_00.end._0_4_ = iVar1;
    name_00.end._4_4_ = in_stack_fffffffffffffe54;
    local_98 = anon_unknown.dwarf_8df1c::AllocateClassMember
                         ((anon_unknown_dwarf_8df1c *)pSVar5,(ExpressionContext *)pFVar4,
                          (SynBase *)0x0,(uint)pTVar7,(TypeBase *)local_a8.begin,name_00,
                          local_a8.end._0_1_,uniqueId);
    pSVar3 = &currScope->types;
    pMVar8 = ExpressionContext::get<MemberHandle>((ExpressionContext *)source_local);
    MemberHandle::MemberHandle(pMVar8,(SynBase *)0x0,local_98,(SynBase *)0x0);
    IntrusiveList<MemberHandle>::push_back((IntrusiveList<MemberHandle> *)&pSVar3->allocator,pMVar8)
    ;
    pSVar5 = source_local;
    pFVar4 = function_local;
    uVar2 = *(uint *)(prev + 3);
    pUVar9 = prev[4];
    local_f0 = prev[5][1].nextUpvalue;
    local_e8 = prev[5][1].copy;
    InplaceStr::InplaceStr((InplaceStr *)&upvalue,"copy");
    prefix.end = (char *)local_e8;
    prefix.begin = (char *)local_f0;
    local_e0 = GetFunctionContextMemberName
                         ((ExpressionContext *)pSVar5,prefix,_upvalue,target._4_4_);
    iVar1 = *(int *)((long)&source_local[0x228].next + 4);
    *(int *)((long)&source_local[0x228].next + 4) = iVar1 + 1;
    name_01.begin._4_4_ = in_stack_fffffffffffffe4c;
    name_01.begin._0_4_ = 1;
    name_01.end._0_4_ = iVar1;
    name_01.end._4_4_ = in_stack_fffffffffffffe54;
    local_d0 = anon_unknown.dwarf_8df1c::AllocateClassMember
                         ((anon_unknown_dwarf_8df1c *)pSVar5,(ExpressionContext *)pFVar4,
                          (SynBase *)(ulong)uVar2,(uint)pUVar9,(TypeBase *)local_e0.begin,name_01,
                          local_e0.end._0_1_,uniqueId);
    pSVar3 = &currScope->types;
    pMVar8 = ExpressionContext::get<MemberHandle>((ExpressionContext *)source_local);
    MemberHandle::MemberHandle(pMVar8,(SynBase *)0x0,local_d0,(SynBase *)0x0);
    IntrusiveList<MemberHandle>::push_back((IntrusiveList<MemberHandle> *)&pSVar3->allocator,pMVar8)
    ;
    source_local[0x205].end = pLStack_50;
    *(undefined1 *)((long)prev + 0x36) = 1;
    pUVar9 = ExpressionContext::get<UpvalueData>((ExpressionContext *)source_local);
    UpvalueData::UpvalueData(pUVar9,(VariableData *)prev,(VariableData *)local_60,local_98,local_d0)
    ;
    local_108 = pUVar9;
    IntrusiveList<UpvalueData>::push_back
              ((IntrusiveList<UpvalueData> *)&data_local[1].offsetUsers,pUVar9);
    SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U>::insert
              ((SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U> *)
               data_local[1].offsetUsers.storage,(VariableData **)&prev,&local_108);
    SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::insert
              ((SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *)
               &data_local[1].offsetUsers.storage[3].value,(InplaceStr *)&prev[5][1].nextUpvalue);
    ctx_local = local_60;
  }
  else {
    ctx_local = (ExpressionContext *)
                ((UpvalueData *)(refType->super_TypeBase)._vptr_TypeBase)->target;
  }
  return (VariableData *)ctx_local;
}

Assistant:

VariableData* AddFunctionUpvalue(ExpressionContext &ctx, SynBase *source, FunctionData *function, VariableData *data)
{
	if(UpvalueData **prev = function->upvalueVariableMap.find(data))
		return (*prev)->target;

	TypeRef *refType = getType<TypeRef>(function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	ScopeData *currScope = ctx.scope;

	ctx.scope = classType->typeScope;

	unsigned index = 0;

	if(function->upvalueNameSet.contains(data->name->name))
		index = classType->members.size();

	// Pointer to target variable
	VariableData *target = AllocateClassMember(ctx, source, 0, ctx.GetReferenceType(data->type), GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("target"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, target, NULL));

	// Pointer to next upvalue
	VariableData *nextUpvalue = AllocateClassMember(ctx, source, 0, ctx.GetReferenceType(ctx.typeVoid), GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("nextUpvalue"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, nextUpvalue, NULL));

	// Copy of the data
	VariableData *copy = AllocateClassMember(ctx, source, data->alignment, data->type, GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("copy"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, copy, NULL));

	ctx.scope = currScope;

	data->usedAsExternal = true;

	UpvalueData *upvalue = new (ctx.get<UpvalueData>()) UpvalueData(data, target, nextUpvalue, copy);

	function->upvalues.push_back(upvalue);

	function->upvalueVariableMap.insert(data, upvalue);
	function->upvalueNameSet.insert(data->name->name);

	return target;
}